

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

int xmlSchemaComparePreserveCollapseStrings(xmlChar *x,xmlChar *y,int invert)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  
  while ((uVar4 = (ulong)*y, uVar4 < 0x21 && ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0))) {
    y = y + 1;
  }
  bVar2 = *x;
  while (bVar3 = (byte)uVar4, bVar2 != 0) {
    if (bVar3 < 0x21) {
      if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 != 0) goto LAB_001ce14f;
      }
      else {
        if (bVar2 == 0x20) {
          do {
            y = y + 1;
            if (0x20 < (ulong)*y) break;
          } while ((0x100002600U >> ((ulong)*y & 0x3f) & 1) != 0);
          goto LAB_001ce159;
        }
        if (bVar2 < 0x20) goto LAB_001ce18b;
      }
LAB_001ce192:
      bVar5 = invert != 0;
      goto LAB_001ce196;
    }
LAB_001ce14f:
    if (bVar2 < bVar3) goto LAB_001ce18b;
    if (bVar2 != bVar3) goto LAB_001ce192;
    y = y + 1;
LAB_001ce159:
    pbVar1 = x + 1;
    x = x + 1;
    uVar4 = (ulong)*y;
    bVar2 = *pbVar1;
  }
  if (bVar3 == 0) {
    return 0;
  }
  do {
    y = y + 1;
    if (0x20 < (byte)uVar4) {
LAB_001ce18b:
      bVar5 = invert == 0;
LAB_001ce196:
      return -(uint)bVar5 | 1;
    }
    if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 == 0) {
        return 0;
      }
      goto LAB_001ce18b;
    }
    uVar4 = (ulong)*y;
  } while( true );
}

Assistant:

static int
xmlSchemaComparePreserveCollapseStrings(const xmlChar *x,
				        const xmlChar *y,
					int invert)
{
    int tmp;

    /*
    * Skip leading blank chars of the collapsed string.
    */
    while IS_WSP_BLANK_CH(*y)
	y++;

    while ((*x != 0) && (*y != 0)) {
	if IS_WSP_BLANK_CH(*y) {
	    if (! IS_WSP_SPACE_CH(*x)) {
		/*
		* The yv character would have been replaced to 0x20.
		*/
		if ((*x - 0x20) < 0) {
		    if (invert)
			return(1);
		    else
			return(-1);
		} else {
		    if (invert)
			return(-1);
		    else
			return(1);
		}
	    }
	    x++;
	    y++;
	    /*
	    * Skip contiguous blank chars of the collapsed string.
	    */
	    while IS_WSP_BLANK_CH(*y)
		y++;
	} else {
	    tmp = *x++ - *y++;
	    if (tmp < 0) {
		if (invert)
		    return(1);
		else
		    return(-1);
	    }
	    if (tmp > 0) {
		if (invert)
		    return(-1);
		else
		    return(1);
	    }
	}
    }